

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O0

bool __thiscall
llama_kv_cache_unified::state_read_meta
          (llama_kv_cache_unified *this,llama_io_read_i *io,uint32_t cell_count,
          llama_seq_id dest_seq_id)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  int in_ECX;
  uint in_EDX;
  long *in_RSI;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  uint32_t cell_id;
  uint32_t i_2;
  int32_t *tail;
  llama_seq_id seq_id;
  uint32_t j;
  uint32_t n_seq_id_1;
  llama_pos pos_1;
  llama_kv_cell *cell;
  uint32_t i_1;
  uint32_t n_seq_id;
  llama_pos pos;
  uint32_t i;
  llama_ubatch batch;
  llama_sbatch sbatch;
  llama_sbatch *this_00;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int32_t *in_stack_fffffffffffffe58;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffe60;
  uint local_190;
  uint local_18c;
  uint local_188;
  llama_pos local_184;
  reference local_180;
  uint local_178;
  int local_174;
  int local_170;
  undefined1 local_16c [3];
  undefined4 in_stack_fffffffffffffe98;
  uint uVar6;
  undefined4 in_stack_fffffffffffffe9c;
  llama_sbatch *in_stack_fffffffffffffea0;
  int *local_138;
  undefined4 *local_130;
  long *local_128;
  llama_ubatch *in_stack_ffffffffffffffc0;
  llama_kv_cache_unified *in_stack_ffffffffffffffc8;
  undefined1 local_20 [4];
  uint local_1c;
  long *local_18;
  byte local_1;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  if (in_ECX == -1) {
    if (*(uint *)((long)in_RDI + 0x6c) < in_EDX) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: not enough cells in kv cache\n","state_read_meta"
                        );
      local_1 = 0;
      goto LAB_0044445e;
    }
    (**(code **)*in_RDI)();
    for (local_178 = 0; local_178 < local_1c; local_178 = local_178 + 1) {
      local_180 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                            ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0xf)
                             ,(ulong)local_178);
      (**(code **)(*local_18 + 0x18))(local_18,&local_184,4);
      (**(code **)(*local_18 + 0x18))(local_18,&local_188,4);
      local_180->pos = local_184;
      for (local_18c = 0; local_18c < local_188; local_18c = local_18c + 1) {
        (**(code **)(*local_18 + 0x18))(local_18,&local_190,4);
        if ((int)local_190 < 0) {
          llama_log_internal(GGML_LOG_LEVEL_ERROR,
                             "%s: invalid seq_id, %d is out of range [0, inf)\n","state_read_meta",
                             (ulong)local_190);
          local_1 = 0;
          goto LAB_0044445e;
        }
        pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffe60._M_node,in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe60 = pVar5.first._M_node;
        if ((*(byte *)((long)in_RDI + 0x62) & 1) != 0) {
          pvVar4 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                             ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                              (in_RDI + 0xf),(long)(int)local_190);
          in_stack_fffffffffffffe58 = &pvVar4->tail;
          if (*in_stack_fffffffffffffe58 != -1) {
            llama_log_internal(GGML_LOG_LEVEL_ERROR,
                               "%s: duplicate tail for seq_id %d in cell %d and %d\n",
                               "state_read_meta",(ulong)local_190,(ulong)local_178,
                               (ulong)(uint)*in_stack_fffffffffffffe58);
            local_1 = 0;
            goto LAB_0044445e;
          }
          *in_stack_fffffffffffffe58 = local_178;
        }
      }
    }
    *(undefined4 *)(in_RDI + 0xd) = 0;
    *(uint *)(in_RDI + 0xe) = local_1c;
  }
  else {
    (**(code **)(*in_RDI + 0x10))(in_RDI,in_ECX,0xffffffff);
    this_00 = (llama_sbatch *)&stack0xfffffffffffffee8;
    llama_sbatch::llama_sbatch(this_00);
    iVar1 = _local_16c;
    uVar6 = (uint)_local_16c >> 0x18;
    llama_sbatch::reserve_ubatch
              (in_stack_fffffffffffffea0,
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),SUB41(uVar6,0));
    _local_16c = iVar1;
    for (uVar6 = 0; uVar6 < local_1c; uVar6 = uVar6 + 1) {
      (**(code **)(*local_18 + 0x18))(local_18,local_16c,4);
      (**(code **)(*local_18 + 0x18))(local_18,&local_170,4);
      if (local_170 != 0) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid seq_id-agnostic kv cell\n",
                           "state_read_meta");
        local_1 = 0;
        local_174 = 1;
        goto LAB_004441fe;
      }
      local_138[uVar6] = _local_16c;
    }
    *local_130 = 1;
    *local_128 = (long)local_20;
    bVar2 = find_slot(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (bVar2) {
      (**(code **)(*in_RDI + 0x50))();
      if (*(uint *)((long)in_RDI + 0x6c) < (int)in_RDI[0xd] + local_1c) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
                   ,0x449,"GGML_ASSERT(%s) failed","head + cell_count <= size");
      }
      pvVar4 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                         ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0xf),
                          (ulong)*(uint *)(in_RDI + 0xd));
      if (pvVar4->pos != *local_138) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
                   ,0x44a,"GGML_ASSERT(%s) failed","cells[head].pos == batch.pos[0]");
      }
      pvVar4 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                         ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0xf),
                          (ulong)(((int)in_RDI[0xd] + local_1c) - 1));
      if (pvVar4->pos != local_138[local_1c - 1]) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
                   ,1099,"GGML_ASSERT(%s) failed",
                   "cells[head + cell_count - 1].pos == batch.pos[cell_count - 1]");
      }
      std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0xf),
                 (ulong)*(uint *)(in_RDI + 0xd));
      bVar2 = llama_kv_cell::has_seq_id
                        ((llama_kv_cell *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (llama_seq_id *)in_RDI);
      if (!bVar2) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
                   ,0x44c,"GGML_ASSERT(%s) failed","cells[head].has_seq_id(dest_seq_id)");
      }
      std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0xf),
                 (ulong)((int)in_RDI[0xd] + -1 + local_1c));
      bVar2 = llama_kv_cell::has_seq_id
                        ((llama_kv_cell *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (llama_seq_id *)in_RDI);
      if (!bVar2) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
                   ,0x44d,"GGML_ASSERT(%s) failed",
                   "cells[head + cell_count - 1].has_seq_id(dest_seq_id)");
      }
      local_174 = 0;
    }
    else {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to find available cells in kv cache\n",
                         "state_read_meta");
      local_1 = 0;
      local_174 = 1;
    }
LAB_004441fe:
    llama_sbatch::~llama_sbatch(this_00);
    if (local_174 != 0) goto LAB_0044445e;
  }
  if ((*(byte *)((long)in_RDI + 0x62) & 1) != 0) {
    for (uVar6 = 0; uVar6 < local_1c; uVar6 = uVar6 + 1) {
      uVar3 = (int)in_RDI[0xd] + uVar6;
      pvVar4 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                         ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0xf),
                          (ulong)uVar3);
      pvVar4->src = uVar3;
    }
  }
  local_1 = 1;
LAB_0044445e:
  return (bool)(local_1 & 1);
}

Assistant:

bool llama_kv_cache_unified::state_read_meta(llama_io_read_i & io, uint32_t cell_count, llama_seq_id dest_seq_id) {
    if (dest_seq_id != -1) {
        // single sequence

        seq_rm(dest_seq_id, -1, -1);

        llama_sbatch sbatch;
        llama_ubatch batch = sbatch.reserve_ubatch(cell_count, /* has_embd */ false);

        batch.n_tokens = cell_count;
        batch.n_seq_tokens = cell_count;
        batch.n_seqs = 1;

        for (uint32_t i = 0; i < cell_count; ++i) {
            llama_pos pos;
            uint32_t n_seq_id;

            io.read_to(&pos,      sizeof(pos));
            io.read_to(&n_seq_id, sizeof(n_seq_id));

            if (n_seq_id != 0) {
                LLAMA_LOG_ERROR("%s: invalid seq_id-agnostic kv cell\n", __func__);
                return false;
            }

            batch.pos[i] = pos;
        }
        batch.n_seq_id[0] = 1;
        batch.seq_id[0] = &dest_seq_id;
        if (!find_slot(batch)) {
            LLAMA_LOG_ERROR("%s: failed to find available cells in kv cache\n", __func__);
            return false;
        }
        commit();

        // DEBUG CHECK: kv.head should be our first cell, kv.head + cell_count - 1 should be our last cell (verify seq_id and pos values)
        // Assume that this is one contiguous block of cells
        GGML_ASSERT(head + cell_count <= size);
        GGML_ASSERT(cells[head].pos == batch.pos[0]);
        GGML_ASSERT(cells[head + cell_count - 1].pos == batch.pos[cell_count - 1]);
        GGML_ASSERT(cells[head].has_seq_id(dest_seq_id));
        GGML_ASSERT(cells[head + cell_count - 1].has_seq_id(dest_seq_id));
    } else {
        // whole KV cache restore

        if (cell_count > size) {
            LLAMA_LOG_ERROR("%s: not enough cells in kv cache\n", __func__);
            return false;
        }

        clear();

        for (uint32_t i = 0; i < cell_count; ++i) {
            llama_kv_cell & cell = cells[i];

            llama_pos pos;
            uint32_t  n_seq_id;

            io.read_to(&pos,      sizeof(pos));
            io.read_to(&n_seq_id, sizeof(n_seq_id));

            cell.pos = pos;

            for (uint32_t j = 0; j < n_seq_id; ++j) {
                llama_seq_id seq_id;
                io.read_to(&seq_id, sizeof(seq_id));

                // TODO: llama_kv_cache_unified should have a notion of max sequences
                //if (seq_id < 0 || (uint32_t) seq_id >= llama_n_seq_max(ctx)) {
                if (seq_id < 0) {
                    //LLAMA_LOG_ERROR("%s: invalid seq_id, %d is out of range [0, %u)\n", __func__, seq_id, llama_n_seq_max(ctx));
                    LLAMA_LOG_ERROR("%s: invalid seq_id, %d is out of range [0, inf)\n", __func__, seq_id);
                    return false;
                }

                cell.seq_id.insert(seq_id);

                if (recurrent) {
                    int32_t & tail = cells[seq_id].tail;
                    if (tail != -1) {
                        LLAMA_LOG_ERROR("%s: duplicate tail for seq_id %d in cell %d and %d\n", __func__, seq_id, i, tail);
                        return false;
                    }
                    tail = i;
                }
            }
        }

        head = 0;
        used = cell_count;
    }

    if (recurrent) {
        for (uint32_t i = 0; i < cell_count; ++i) {
            uint32_t cell_id = head + i;
            // make sure the recurrent states will keep their restored state
            cells[cell_id].src = cell_id;
        }
    }

    return true;
}